

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
          (View<int,_true,_std::allocator<unsigned_long>_> *this,size_t c1,size_t c2)

{
  ulong uVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *psVar4;
  runtime_error *this_00;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    uVar1 = (this->geometry_).dimension_;
    if ((c1 < uVar1) && (c2 < uVar1)) {
      psVar2 = (this->geometry_).shape_;
      sVar6 = psVar2[c2];
      psVar2[c2] = psVar2[c1];
      if (c1 < (this->geometry_).dimension_) {
        psVar2[c1] = sVar6;
        uVar1 = (this->geometry_).dimension_;
        if (c2 < uVar1) {
          if (c1 < uVar1) {
            psVar3 = (this->geometry_).strides_;
            sVar6 = psVar3[c2];
            psVar3[c2] = psVar3[c1];
            if (c1 < (this->geometry_).dimension_) {
              psVar3[c1] = sVar6;
              sVar6 = (this->geometry_).dimension_;
              if (sVar6 != 0) {
                psVar4 = (this->geometry_).shapeStrides_;
                if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
                  psVar4[sVar6 - 1] = 1;
                  if (sVar6 != 1) {
                    sVar7 = 1;
                    do {
                      sVar7 = sVar7 * psVar2[sVar6 - 1];
                      psVar4[sVar6 - 2] = sVar7;
                      sVar6 = sVar6 - 1;
                    } while (sVar6 != 1);
                  }
                }
                else {
                  *psVar4 = 1;
                  if (sVar6 != 1) {
                    sVar7 = 1;
                    lVar8 = 0;
                    do {
                      sVar7 = sVar7 * psVar2[lVar8];
                      psVar4[lVar8 + 1] = sVar7;
                      lVar8 = lVar8 + 1;
                    } while (sVar6 - 1 != lVar8);
                  }
                }
                sVar6 = (this->geometry_).dimension_;
                bVar5 = true;
                if (sVar6 != 0) {
                  sVar7 = 0;
                  do {
                    if (psVar4[sVar7] != psVar3[sVar7]) {
                      bVar5 = false;
                      break;
                    }
                    sVar7 = sVar7 + 1;
                  } while (sVar6 != sVar7);
                }
                (this->geometry_).isSimple_ = bVar5;
                testInvariant(this);
                return;
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
            }
          }
          else {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
          }
        }
        else {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
        }
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
View<T, isConst, A>::transpose
(
    const std::size_t c1,
    const std::size_t c2
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST ||
        (dimension() != 0 && c1 < dimension() && c2 < dimension()));

    std::size_t j1 = c1;
    std::size_t j2 = c2;
    std::size_t c;
    std::size_t d;

    // transpose shape
    c = geometry_.shape(j2);
    geometry_.shape(j2) = geometry_.shape(j1);
    geometry_.shape(j1) = c;

    // transpose strides
    d = geometry_.strides(j2);
    geometry_.strides(j2) = geometry_.strides(j1);
    geometry_.strides(j1) = d;

    // update shape strides
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());

    updateSimplicity();
    testInvariant();
}